

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O0

void __thiscall
TxIn_EstimateTxInSize_Test::TxIn_EstimateTxInSize_Test(TxIn_EstimateTxInSize_Test *this)

{
  TxIn_EstimateTxInSize_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TxIn_EstimateTxInSize_Test_0066f668;
  return;
}

Assistant:

TEST(TxIn, EstimateTxInSize) {
  static const std::vector<TestEstimateTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script()},
    {AddressType::kP2shAddress, 208, 0, exp_script},
    {AddressType::kP2shP2wpkhAddress, 173, 109, Script()},
    {AddressType::kP2shP2wshAddress, 219, 143, Script("51")},
    {AddressType::kP2wpkhAddress, 150, 109, Script()},
    {AddressType::kP2wshAddress, 208, 167, exp_script},
  };

  for (const auto& test_data : test_vector) {
    uint32_t size = 0;
    uint32_t wit_size = 0;
    EXPECT_NO_THROW((size = TxIn::EstimateTxInSize(
        test_data.addr_type, test_data.redeem_script, &wit_size)));
    EXPECT_EQ(size, test_data.size);
    EXPECT_EQ(wit_size, test_data.witness_size);
  }
}